

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O1

int TeleportGetParameter(int stream,int index,float *value)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (Teleport::GetSharedMemory()::shared == '\0') {
    iVar1 = __cxa_guard_acquire(&Teleport::GetSharedMemory()::shared);
    if (iVar1 != 0) {
      Teleport::SharedMemoryHandle::SharedMemoryHandle
                ((SharedMemoryHandle *)&Teleport::GetSharedMemory()::shared);
      __cxa_atexit(Teleport::SharedMemoryHandle::~SharedMemoryHandle,
                   &Teleport::GetSharedMemory()::shared,&__dso_handle);
      __cxa_guard_release(&Teleport::GetSharedMemory()::shared);
    }
  }
  lVar2 = (long)stream * 0x56248 + Teleport::GetSharedMemory()::shared;
  lVar3 = (long)index;
  *value = *(float *)(lVar2 + lVar3 * 8);
  iVar1 = *(int *)(lVar2 + 4 + lVar3 * 8);
  *(undefined4 *)(lVar2 + 4 + lVar3 * 8) = 0;
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportGetParameter(int stream, int index, float* value)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    *value = s.params[index].value;
    int changed = s.params[index].changed;
    s.params[index].changed = 0;
    return changed;
}